

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DrawMeshIndirect
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DrawMeshIndirectAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char *in_R8;
  char (*in_R9) [8];
  PipelineStateVkImpl *pPVar4;
  string msg;
  String local_40;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    CVar2 = (this->m_Desc).QueueType;
    if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&msg,(char (*) [79])
                        "Queue type may never be unknown for immediate contexts. This looks like a bug."
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DrawMeshIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x95c);
        std::__cxx11::string::~string((string *)&msg);
      }
      FormatString<char[97]>
                (&msg,(char (*) [97])
                      "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95c);
      std::__cxx11::string::~string((string *)&msg);
      CVar2 = (this->m_Desc).QueueType;
      Type = extraout_DL;
    }
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                (&msg,(Diligent *)"DrawMeshIndirect",(char (*) [17])0x65e20a,
                 (char (*) [22])&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)&local_40);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95c);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((((this->m_pDevice).m_pObject)->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.MeshShaders ==
        DEVICE_FEATURE_STATE_DISABLED) {
      FormatString<char[64]>
                (&msg,(char (*) [64])
                      "DrawMeshIndirect: mesh shaders are not supported by this device");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x95e);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((Attribs->pCounterBuffer != (IBuffer *)0x0) &&
       (((((this->m_pDevice).m_pObject)->
         super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
         ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.DrawCommand.CapFlags &
        DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) == DRAW_COMMAND_CAP_FLAG_NONE)) {
      FormatString<char[134]>
                (&msg,(char (*) [134])
                      "DrawMeshIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x961);
      std::__cxx11::string::~string((string *)&msg);
    }
    pPVar4 = (this->m_pPipelineState).m_pObject;
    if (pPVar4 == (PipelineStateVkImpl *)0x0) {
      FormatString<char[76]>
                (&msg,(char (*) [76])
                      "DrawMeshIndirect command arguments are invalid: no pipeline state is bound.")
      ;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x964);
      std::__cxx11::string::~string((string *)&msg);
      pPVar4 = (this->m_pPipelineState).m_pObject;
    }
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if ((pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_MESH) {
      pPVar4 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      FormatString<char[65],char_const*,char[26]>
                (&msg,(Diligent *)
                      "DrawMeshIndirect command arguments are invalid: pipeline state \'",
                 (char (*) [65])
                 &(pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a mesh pipeline.",(char (*) [26])in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x968);
      std::__cxx11::string::~string((string *)&msg);
    }
    bVar3 = VerifyDrawMeshIndirectAttribs(Attribs,0xc);
    if (!bVar3) {
      FormatString<char[36]>(&msg,(char (*) [36])"DrawMeshIndirectAttribs are invalid");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawMeshIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x96a);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DrawMeshIndirect;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawMeshIndirect(const DrawMeshIndirectAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawMeshIndirect");

        DEV_CHECK_ERR(m_pDevice->GetFeatures().MeshShaders, "DrawMeshIndirect: mesh shaders are not supported by this device");

        DEV_CHECK_ERR(Attribs.pCounterBuffer == nullptr || (m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER) != 0,
                      "DrawMeshIndirect command arguments are invalid: counter buffer requires DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER capability");
        // There is no need to check DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT because an indirect buffer can only be created if this capability is supported.

        DEV_CHECK_ERR(m_pPipelineState, "DrawMeshIndirect command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_MESH,
                      "DrawMeshIndirect command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a mesh pipeline.");

        DEV_CHECK_ERR(VerifyDrawMeshIndirectAttribs(Attribs, DrawMeshIndirectCommandStride), "DrawMeshIndirectAttribs are invalid");
    }
#endif
    ++m_Stats.CommandCounters.DrawMeshIndirect;
}